

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Solver.h
# Opt level: O1

void __thiscall Minisat::Solver::binDRUP_strengthen(Solver *this,Clause *c,Lit l,FILE *drup_file)

{
  int iVar1;
  uchar *puVar2;
  byte *pbVar3;
  OnlineProofChecker *this_00;
  bool bVar4;
  ulong uVar5;
  uint uVar6;
  Lit local_3c;
  FILE *local_38;
  
  puVar2 = this->buf_ptr;
  this->buf_ptr = puVar2 + 1;
  *puVar2 = 'a';
  this->buf_len = this->buf_len + 1;
  if ((ulong)c->header >> 0x22 != 0) {
    uVar5 = 0;
    do {
      iVar1 = *(int *)(&c[1].header.field_0x0 + uVar5 * 4);
      if (iVar1 != l.x) {
        uVar6 = iVar1 + 2;
        do {
          pbVar3 = this->buf_ptr;
          this->buf_ptr = pbVar3 + 1;
          *pbVar3 = (byte)uVar6 | 0x80;
          this->buf_len = this->buf_len + 1;
          bVar4 = 0x7f < uVar6;
          uVar6 = uVar6 >> 7;
        } while (bVar4);
        this->buf_ptr[-1] = this->buf_ptr[-1] & 0x7f;
      }
      uVar5 = uVar5 + 1;
    } while (uVar5 < (ulong)c->header >> 0x22);
  }
  this_00 = this->onlineDratChecker;
  if (this_00 != (OnlineProofChecker *)0x0) {
    if ((this_00->tmpLits).data != (Lit *)0x0) {
      (this_00->tmpLits).sz = 0;
    }
    local_38 = (FILE *)drup_file;
    if (0x3ffffffff < (ulong)c->header) {
      uVar5 = 0;
      do {
        iVar1 = *(int *)(&c[1].header.field_0x0 + uVar5 * 4);
        if (iVar1 != l.x) {
          local_3c.x = iVar1;
          vec<Minisat::Lit>::push(&this_00->tmpLits,&local_3c);
        }
        uVar5 = uVar5 + 1;
      } while (uVar5 < (ulong)c->header >> 0x22);
    }
    bVar4 = OnlineProofChecker::addClause(this_00,&this_00->tmpLits,false);
    drup_file = (FILE *)local_38;
    if (!bVar4) {
      exit(0x86);
    }
  }
  puVar2 = this->buf_ptr;
  this->buf_ptr = puVar2 + 1;
  *puVar2 = '\0';
  iVar1 = this->buf_len;
  uVar6 = iVar1 + 1;
  this->buf_len = uVar6;
  if (0xfffff < iVar1) {
    fwrite_unlocked(drup_buf,1,(ulong)uVar6,(FILE *)drup_file);
    this->buf_ptr = drup_buf;
    this->buf_len = 0;
  }
  return;
}

Assistant:

inline void binDRUP_strengthen(const Clause &c, Lit l, FILE *drup_file)
    {
        *buf_ptr++ = 'a';
        buf_len++;
        for (int i = 0; i < c.size(); i++)
            if (c[i] != l) byteDRUP(c[i]);
        if (onlineDratChecker)
            if (!onlineDratChecker->addStrengthenedClause(c, l)) exit(134);
        *buf_ptr++ = 0;
        buf_len++;
        if (buf_len > 1048576) binDRUP_flush(drup_file);
    }